

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_init_from_reader_v2(mz_zip_archive *pZip,char *pFilename,mz_uint flags)

{
  FILE *pFVar1;
  mz_zip_internal_state *pmVar2;
  code *pcVar3;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar2 = pZip->m_pState;
  if ((pmVar2 == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
  goto LAB_0014fbe9;
  if ((flags >> 0xe & 1) == 0) {
    if (pmVar2->m_zip64 != 0) goto LAB_0014fb25;
    if (pZip->m_total_files == 0xffff) goto LAB_0014fb79;
    if (pZip->m_archive_size - 0xffffffb4 < 0xffffffff00000000) {
      pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
      return 0;
    }
  }
  else {
    if (pmVar2->m_zip64 == 0) goto LAB_0014fbe9;
LAB_0014fb25:
    if (pZip->m_total_files == 0xffffffff) {
LAB_0014fb79:
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  if ((FILE *)pmVar2->m_pFile == (FILE *)0x0) {
    if (pmVar2->m_pMem == (void *)0x0) {
      if (pZip->m_pWrite == (mz_file_write_func)0x0) goto LAB_0014fbe9;
      goto LAB_0014fbb9;
    }
    if ((mz_zip_archive *)pZip->m_pIO_opaque != pZip) {
LAB_0014fbe9:
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    pmVar2->m_mem_capacity = pmVar2->m_mem_size;
    pcVar3 = mz_zip_heap_write_func;
  }
  else {
    if ((mz_zip_archive *)pZip->m_pIO_opaque != pZip) goto LAB_0014fbe9;
    pcVar3 = mz_zip_file_write_func;
    if (pZip->m_zip_type == MZ_ZIP_TYPE_FILE) {
      if (pFilename == (char *)0x0) goto LAB_0014fbe9;
      pFVar1 = freopen64(pFilename,"r+b",(FILE *)pmVar2->m_pFile);
      pmVar2->m_pFile = (FILE *)pFVar1;
      if (pFVar1 == (FILE *)0x0) {
        mz_zip_reader_end_internal(pZip,0);
        pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
        return 0;
      }
      pmVar2 = pZip->m_pState;
    }
  }
  pZip->m_pWrite = pcVar3;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
LAB_0014fbb9:
  pZip->m_archive_size = pZip->m_central_directory_file_ofs;
  pZip->m_central_directory_file_ofs = 0;
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(pmVar2->m_sorted_central_dir_offsets).m_p);
  (pmVar2->m_sorted_central_dir_offsets).m_capacity = 0;
  *(undefined8 *)&(pmVar2->m_sorted_central_dir_offsets).m_element_size = 0;
  (pmVar2->m_sorted_central_dir_offsets).m_p = (void *)0x0;
  (pmVar2->m_sorted_central_dir_offsets).m_size = 0;
  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_init_from_reader_v2(mz_zip_archive *pZip, const char *pFilename, mz_uint flags)
{
    mz_zip_internal_state *pState;

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (flags & MZ_ZIP_FLAG_WRITE_ZIP64)
    {
        /* We don't support converting a non-zip64 file to zip64 - this seems like more trouble than it's worth. (What about the existing 32-bit data descriptors that could follow the compressed data?) */
        if (!pZip->m_pState->m_zip64)
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* No sense in trying to write to an archive that's already at the support max size */
    if (pZip->m_pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        if ((pZip->m_archive_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_ZIP_LOCAL_DIR_HEADER_SIZE) > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
    }

    pState = pZip->m_pState;

    if (pState->m_pFile)
    {
#ifdef MINIZ_NO_STDIO
        (void)pFilename;
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
#else
        if (pZip->m_pIO_opaque != pZip)
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

        if (pZip->m_zip_type == MZ_ZIP_TYPE_FILE)
        {
            if (!pFilename)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

            /* Archive is being read from stdio and was originally opened only for reading. Try to reopen as writable. */
            if (NULL == (pState->m_pFile = MZ_FREOPEN(pFilename, "r+b", pState->m_pFile)))
            {
                /* The mz_zip_archive is now in a bogus state because pState->m_pFile is NULL, so just close it. */
                mz_zip_reader_end_internal(pZip, MZ_FALSE);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);
            }
        }

        pZip->m_pWrite = mz_zip_file_write_func;
        pZip->m_pNeeds_keepalive = NULL;
#endif /* #ifdef MINIZ_NO_STDIO */
    }
    else if (pState->m_pMem)
    {
        /* Archive lives in a memory block. Assume it's from the heap that we can resize using the realloc callback. */
        if (pZip->m_pIO_opaque != pZip)
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

        pState->m_mem_capacity = pState->m_mem_size;
        pZip->m_pWrite = mz_zip_heap_write_func;
        pZip->m_pNeeds_keepalive = NULL;
    }
    /* Archive is being read via a user provided read function - make sure the user has specified a write function too. */
    else if (!pZip->m_pWrite)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Start writing new files at the archive's current central directory location. */
    /* TODO: We could add a flag that lets the user start writing immediately AFTER the existing central dir - this would be safer. */
    pZip->m_archive_size = pZip->m_central_directory_file_ofs;
    pZip->m_central_directory_file_ofs = 0;

    /* Clear the sorted central dir offsets, they aren't useful or maintained now. */
    /* Even though we're now in write mode, files can still be extracted and verified, but file locates will be slow. */
    /* TODO: We could easily maintain the sorted central directory offsets. */
    mz_zip_array_clear(pZip, &pZip->m_pState->m_sorted_central_dir_offsets);

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;

    return MZ_TRUE;
}